

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes WaitId(CSzData *sd,UInt32 id)

{
  SRes SVar1;
  uint in_ESI;
  CSzData *in_RDI;
  int __result___1;
  int __result__;
  UInt64 type;
  ulong local_20;
  undefined4 in_stack_ffffffffffffffe8;
  
  do {
    SVar1 = ReadNumber(in_RDI,&local_20);
    if (SVar1 != 0) {
      return SVar1;
    }
    if (local_20 == in_ESI) {
      return 0;
    }
    if (local_20 == 0) {
      return 0x10;
    }
    SVar1 = SkipData((CSzData *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  } while (SVar1 == 0);
  return SVar1;
}

Assistant:

static SRes WaitId(CSzData *sd, UInt32 id)
{
  for (;;)
  {
    UInt64 type;
    RINOK(ReadID(sd, &type));
    if (type == id)
      return SZ_OK;
    if (type == k7zIdEnd)
      return SZ_ERROR_ARCHIVE;
    RINOK(SkipData(sd));
  }
}